

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O3

bool crnlib::file_utils::split_path
               (char *p,dynamic_string *pDrive,dynamic_string *pDir,dynamic_string *pFilename,
               dynamic_string *pExt)

{
  char *pcVar1;
  char nametmp [1024];
  char dirtmp [1024];
  dynamic_string dStack_848;
  char local_838 [1024];
  char local_438 [1032];
  
  strcpy_safe(local_438,0x400,p);
  strcpy_safe(local_838,0x400,p);
  if (pDrive != (dynamic_string *)0x0) {
    dynamic_string::clear(pDrive);
  }
  pcVar1 = dirname(local_438);
  if (pcVar1 != (char *)0x0) {
    if (pDir != (dynamic_string *)0x0) {
      dynamic_string::set(pDir,pcVar1,0xffffffff);
      if ((pDir->m_len != 0) && (pDir->m_pStr[pDir->m_len - 1] != '/')) {
        dynamic_string::append_char(pDir,'/');
      }
    }
    pcVar1 = __xpg_basename(local_838);
    if (pcVar1 != (char *)0x0) {
      if (pFilename != (dynamic_string *)0x0) {
        dynamic_string::set(pFilename,pcVar1,0xffffffff);
        remove_extension(pFilename);
      }
      if (pExt == (dynamic_string *)0x0) {
        return true;
      }
      dynamic_string::set(pExt,pcVar1,0xffffffff);
      get_extension(pExt);
      operator+((crnlib *)&dStack_848,".",pExt);
      dynamic_string::set(pExt,&dStack_848,0xffffffff);
      if (dStack_848.m_pStr == (char *)0x0) {
        return true;
      }
      if ((*(uint *)(dStack_848.m_pStr + -8) ^ *(uint *)(dStack_848.m_pStr + -4)) != 0xffffffff) {
        return true;
      }
      crnlib_free(dStack_848.m_pStr + -0x10);
      return true;
    }
  }
  return false;
}

Assistant:

bool file_utils::split_path(const char* p, dynamic_string* pDrive, dynamic_string* pDir, dynamic_string* pFilename, dynamic_string* pExt) {
  CRNLIB_ASSERT(p);

#ifdef WIN32
  char drive_buf[_MAX_DRIVE];
  char dir_buf[_MAX_DIR];
  char fname_buf[_MAX_FNAME];
  char ext_buf[_MAX_EXT];

#ifdef _MSC_VER
  // Compiling with MSVC
  errno_t error = _splitpath_s(p,
                               pDrive ? drive_buf : NULL, pDrive ? _MAX_DRIVE : 0,
                               pDir ? dir_buf : NULL, pDir ? _MAX_DIR : 0,
                               pFilename ? fname_buf : NULL, pFilename ? _MAX_FNAME : 0,
                               pExt ? ext_buf : NULL, pExt ? _MAX_EXT : 0);
  if (error != 0)
    return false;
#else
  // Compiling with MinGW
  _splitpath(p,
             pDrive ? drive_buf : NULL,
             pDir ? dir_buf : NULL,
             pFilename ? fname_buf : NULL,
             pExt ? ext_buf : NULL);
#endif

  if (pDrive)
    *pDrive = drive_buf;
  if (pDir)
    *pDir = dir_buf;
  if (pFilename)
    *pFilename = fname_buf;
  if (pExt)
    *pExt = ext_buf;
#else
  char dirtmp[1024];
  char nametmp[1024];
  strcpy_safe(dirtmp, sizeof(dirtmp), p);
  strcpy_safe(nametmp, sizeof(nametmp), p);

  if (pDrive)
    pDrive->clear();

  const char* pDirName = dirname(dirtmp);
  if (!pDirName)
    return false;

  if (pDir) {
    pDir->set(pDirName);
    if ((!pDir->is_empty()) && (pDir->back() != '/'))
      pDir->append_char('/');
  }

  const char* pBaseName = basename(nametmp);
  if (!pBaseName)
    return false;

  if (pFilename) {
    pFilename->set(pBaseName);
    remove_extension(*pFilename);
  }

  if (pExt) {
    pExt->set(pBaseName);
    get_extension(*pExt);
    *pExt = "." + *pExt;
  }
#endif  // #ifdef WIN32

  return true;
}